

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O1

void __thiscall
preciseunitOps_flagClearSet_Test::~preciseunitOps_flagClearSet_Test
          (preciseunitOps_flagClearSet_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(preciseunitOps, flagClearSet)
{
    precise_unit m1(0.245, precise::yd);
    m1.set_flags(false, true, false);
    EXPECT_FALSE(m1.is_per_unit());
    EXPECT_TRUE(m1.has_i_flag());
    EXPECT_FALSE(m1.has_e_flag());

    m1.set_flags(true, false, true);
    EXPECT_TRUE(m1.is_per_unit());
    EXPECT_FALSE(m1.has_i_flag());
    EXPECT_TRUE(m1.has_e_flag());

    m1.clear_flags();
    EXPECT_FALSE(m1.is_per_unit());
    EXPECT_FALSE(m1.has_i_flag());
    EXPECT_FALSE(m1.has_e_flag());
}